

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void DiscardContainer(TidyDocImpl *doc,Node *element,Node **pnode)

{
  Node *pNVar1;
  Node *parent;
  Node *node;
  Node **pnode_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  if (element->content == (Node *)0x0) {
    pNVar1 = prvTidyDiscardElement(doc,element);
    *pnode = pNVar1;
  }
  else {
    pNVar1 = element->parent;
    element->last->next = element->next;
    if (element->next == (Node *)0x0) {
      pNVar1->last = element->last;
    }
    else {
      element->next->prev = element->last;
    }
    if (element->prev == (Node *)0x0) {
      pNVar1->content = element->content;
    }
    else {
      element->content->prev = element->prev;
      element->prev->next = element->content;
    }
    for (parent = element->content; parent != (Node *)0x0; parent = parent->next) {
      parent->parent = pNVar1;
    }
    *pnode = element->content;
    element->content = (Node *)0x0;
    element->next = (Node *)0x0;
    prvTidyFreeNode(doc,element);
  }
  return;
}

Assistant:

static void DiscardContainer( TidyDocImpl* doc, Node *element, Node **pnode)
{
    if (element->content)
    {
        Node *node, *parent = element->parent;

        element->last->next = element->next;

        if (element->next)
        {
            element->next->prev = element->last;
        }
        else
            parent->last = element->last;

        if (element->prev)
        {
            element->content->prev = element->prev;
            element->prev->next = element->content;
        }
        else
            parent->content = element->content;

        for (node = element->content; node; node = node->next)
            node->parent = parent;

        *pnode = element->content;

        element->next = element->content = NULL;
        TY_(FreeNode)(doc, element);
    }
    else
    {
        *pnode = TY_(DiscardElement)(doc, element);
    }
}